

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger generator_getstatus(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQGeneratorState SVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr local_18;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  SVar2 = ((pSVar3->super_SQObject)._unVal.pGenerator)->_state;
  if (SVar2 == eRunning) {
    local_18.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"running",-1);
    local_18.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  else if (SVar2 == eDead) {
    local_18.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"dead",-1);
    local_18.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  else {
    if (SVar2 != eSuspended) {
      return 1;
    }
    local_18.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"suspended",-1);
    local_18.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  SQObjectPtr::~SQObjectPtr(&local_18);
  return 1;
}

Assistant:

static SQInteger generator_getstatus(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    switch(_generator(o)->_state){
        case SQGenerator::eSuspended:v->Push(SQString::Create(_ss(v),_SC("suspended")));break;
        case SQGenerator::eRunning:v->Push(SQString::Create(_ss(v),_SC("running")));break;
        case SQGenerator::eDead:v->Push(SQString::Create(_ss(v),_SC("dead")));break;
    }
    return 1;
}